

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void getPixelColorsRGB8(uchar *buffer,size_t numpixels,uchar *in,LodePNGColorMode *mode)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  int *in_RCX;
  void *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  uint index_1;
  size_t j_1;
  uint index;
  uint value;
  size_t j;
  uint highest;
  size_t i;
  uint num_channels;
  size_t in_stack_ffffffffffffffb0;
  size_t nbits;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  size_t *in_stack_ffffffffffffffc0;
  size_t *bitpointer;
  long local_30;
  undefined1 *local_8;
  
  local_8 = in_RDI;
  if (*in_RCX == 0) {
    if (in_RCX[1] == 8) {
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        uVar1 = *(undefined1 *)((long)in_RDX + local_30);
        local_8[2] = uVar1;
        local_8[1] = uVar1;
        *local_8 = uVar1;
        local_8 = local_8 + 3;
      }
    }
    else if (in_RCX[1] == 0x10) {
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        uVar1 = *(undefined1 *)((long)in_RDX + local_30 * 2);
        local_8[2] = uVar1;
        local_8[1] = uVar1;
        *local_8 = uVar1;
        local_8 = local_8 + 3;
      }
    }
    else {
      iVar2 = in_RCX[1];
      bitpointer = (size_t *)0x0;
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        in_stack_ffffffffffffffbc =
             readBitsFromReversedStream
                       (bitpointer,
                        (uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                        in_stack_ffffffffffffffb0);
        uVar1 = (undefined1)
                ((in_stack_ffffffffffffffbc * 0xff) / ((1 << ((byte)iVar2 & 0x1f)) - 1U));
        local_8[2] = uVar1;
        local_8[1] = uVar1;
        *local_8 = uVar1;
        local_8 = local_8 + 3;
      }
    }
  }
  else if (*in_RCX == 2) {
    if (in_RCX[1] == 8) {
      lodepng_memcpy(in_RDI,in_RDX,in_RSI * 3);
    }
    else {
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        *local_8 = *(undefined1 *)((long)in_RDX + local_30 * 6);
        local_8[1] = *(undefined1 *)((long)in_RDX + local_30 * 6 + 2);
        local_8[2] = *(undefined1 *)((long)in_RDX + local_30 * 6 + 4);
        local_8 = local_8 + 3;
      }
    }
  }
  else if (*in_RCX == 3) {
    if (in_RCX[1] == 8) {
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        lodepng_memcpy(local_8,(void *)(*(long *)(in_RCX + 2) +
                                       (ulong)*(byte *)((long)in_RDX + local_30) * 4),3);
        local_8 = local_8 + 3;
      }
    }
    else {
      nbits = 0;
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        uVar3 = readBitsFromReversedStream
                          (in_stack_ffffffffffffffc0,
                           (uchar *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           nbits);
        lodepng_memcpy(local_8,(void *)(*(long *)(in_RCX + 2) + (ulong)(uVar3 << 2)),3);
        local_8 = local_8 + 3;
      }
    }
  }
  else if (*in_RCX == 4) {
    if (in_RCX[1] == 8) {
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        uVar1 = *(undefined1 *)((long)in_RDX + local_30 * 2);
        local_8[2] = uVar1;
        local_8[1] = uVar1;
        *local_8 = uVar1;
        local_8 = local_8 + 3;
      }
    }
    else {
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        uVar1 = *(undefined1 *)((long)in_RDX + local_30 * 4);
        local_8[2] = uVar1;
        local_8[1] = uVar1;
        *local_8 = uVar1;
        local_8 = local_8 + 3;
      }
    }
  }
  else if (*in_RCX == 6) {
    if (in_RCX[1] == 8) {
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        lodepng_memcpy(local_8,(void *)((long)in_RDX + local_30 * 4),3);
        local_8 = local_8 + 3;
      }
    }
    else {
      for (local_30 = 0; local_30 != in_RSI; local_30 = local_30 + 1) {
        *local_8 = *(undefined1 *)((long)in_RDX + local_30 * 8);
        local_8[1] = *(undefined1 *)((long)in_RDX + local_30 * 8 + 2);
        local_8[2] = *(undefined1 *)((long)in_RDX + local_30 * 8 + 4);
        local_8 = local_8 + 3;
      }
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGB8(unsigned char* LODEPNG_RESTRICT buffer, size_t numpixels,
  const unsigned char* LODEPNG_RESTRICT in,
  const LodePNGColorMode* mode) {
  const unsigned num_channels = 3;
  size_t i;
  if (mode->colortype == LCT_GREY) {
    if (mode->bitdepth == 8) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i];
      }
    }
    else if (mode->bitdepth == 16) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
      }
    }
    else {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
      }
    }
  }
  else if (mode->colortype == LCT_RGB) {
    if (mode->bitdepth == 8) {
      lodepng_memcpy(buffer, in, numpixels * 3);
    }
    else {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
      }
    }
  }
  else if (mode->colortype == LCT_PALETTE) {
    if (mode->bitdepth == 8) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = in[i];
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 3);
      }
    }
    else {
      size_t j = 0;
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = readBitsFromReversedStream(&j, in, mode->bitdepth);
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 3);
      }
    }
  }
  else if (mode->colortype == LCT_GREY_ALPHA) {
    if (mode->bitdepth == 8) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
      }
    }
    else {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
      }
    }
  }
  else if (mode->colortype == LCT_RGBA) {
    if (mode->bitdepth == 8) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        lodepng_memcpy(buffer, &in[i * 4], 3);
      }
    }
    else {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
      }
    }
  }
}